

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ID.cpp
# Opt level: O0

int __thiscall ID_table_t::find_pos(ID_table_t *this,string *id_name)

{
  bool bVar1;
  __type _Var2;
  undefined1 local_58 [40];
  const_iterator cStack_30;
  int i;
  const_iterator end;
  const_iterator ptr;
  string *id_name_local;
  ID_table_t *this_local;
  
  end = std::vector<ID,_std::allocator<ID>_>::cbegin(&this->table);
  cStack_30 = std::vector<ID,_std::allocator<ID>_>::cend(&this->table);
  local_58._36_4_ = 0;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&stack0xffffffffffffffd0);
    if (!bVar1) {
      return -1;
    }
    __gnu_cxx::__normal_iterator<const_ID_*,_std::vector<ID,_std::allocator<ID>_>_>::operator->
              (&end);
    ID::get_name_abi_cxx11_((ID *)local_58);
    _Var2 = std::operator==(id_name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    if (_Var2) break;
    __gnu_cxx::__normal_iterator<const_ID_*,_std::vector<ID,_std::allocator<ID>_>_>::operator++
              (&end);
    local_58._36_4_ = local_58._36_4_ + 1;
  }
  return local_58._36_4_;
}

Assistant:

int ID_table_t::find_pos(const string id_name) const {
    vector<ID>::const_iterator ptr = table.cbegin();
    vector<ID>::const_iterator end  = table.cend();
    int i = 0;

    while(ptr != end){
        if(id_name == ptr->get_name())
            return i;
        ++ptr;
        ++i;
    }
    return -1;
}